

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_WaitForSlotEvent(SoftHSM *this,CK_FLAGS flags,CK_SLOT_ID_PTR param_2,CK_VOID_PTR param_3)

{
  CK_VOID_PTR param_3_local;
  CK_SLOT_ID_PTR param_2_local;
  CK_FLAGS flags_local;
  SoftHSM *this_local;
  CK_RV local_8;
  
  if ((flags & 1) == 0) {
    local_8 = 0x54;
  }
  else if ((this->isInitialised & 1U) == 0) {
    local_8 = 400;
  }
  else {
    local_8 = 8;
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_WaitForSlotEvent(CK_FLAGS flags, CK_SLOT_ID_PTR /*pSlot*/, CK_VOID_PTR /*pReserved*/)
{
	if (!(flags & CKF_DONT_BLOCK)) return CKR_FUNCTION_NOT_SUPPORTED;

	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// SoftHSM slots don't change after it's initialised. With the
	// exception of when a slot is initialised and then getSlotList() is
	// called. However, at this point the caller has been updated with the
	// new slot list already so no event needs to be triggered.
	return CKR_NO_EVENT;
}